

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char8_t * fmt::v5::internal::
          parse_align<fmt::v5::char8_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>>&>
                    (char8_t *begin,char8_t *end,
                    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                    *handler)

{
  bool bVar1;
  char *message;
  specs_setter<fmt::v5::char8_t> *in_RDX;
  char8_t *in_RSI;
  char8_t *in_RDI;
  char8_t c;
  int i;
  alignment align;
  undefined7 in_stack_ffffffffffffffd0;
  char8_t in_stack_ffffffffffffffd7;
  uint local_28;
  int local_24;
  char8_t *local_10;
  
  local_24 = 0;
  local_28 = (uint)(in_RDI + 1 != in_RSI);
  while( true ) {
    message = (char *)(ulong)((int)(char)in_RDI[(int)local_28] - 0x3c);
    switch(message) {
    case (char *)0x0:
      local_24 = 1;
      break;
    case (char *)0x1:
      local_24 = 4;
      break;
    case (char *)0x2:
      local_24 = 2;
      break;
    case (char *)0x22:
      local_24 = 3;
    }
    if (local_24 != 0) break;
    bVar1 = (int)local_28 < 1;
    local_28 = local_28 - 1;
    if (bVar1) {
      return in_RDI;
    }
  }
  if ((int)local_28 < 1) {
    local_10 = in_RDI + 1;
  }
  else {
    in_stack_ffffffffffffffd7 = *in_RDI;
    if (in_stack_ffffffffffffffd7 == 0x7b) {
      specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
      ::on_error((specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                  *)CONCAT17(0x7b,in_stack_ffffffffffffffd0),message);
      return in_RDI;
    }
    local_10 = in_RDI + 2;
    specs_setter<fmt::v5::char8_t>::on_fill(in_RDX,in_stack_ffffffffffffffd7);
  }
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
  ::on_align((specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
              *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
             (alignment)((ulong)message >> 0x20));
  return local_10;
}

Assistant:

FMT_CONSTEXPR const Char *parse_align(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  alignment align = ALIGN_DEFAULT;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = ALIGN_LEFT;
      break;
    case '>':
      align = ALIGN_RIGHT;
      break;
    case '=':
      align = ALIGN_NUMERIC;
      break;
    case '^':
      align = ALIGN_CENTER;
      break;
    }
    if (align != ALIGN_DEFAULT) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}